

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_order.c
# Opt level: O1

longlong amd_l_order(longlong n,longlong *Ap,longlong *Ai,longlong *P,c_float *Control,c_float *Info
                    )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  longlong lVar4;
  c_float cVar5;
  longlong *W;
  longlong *Flag;
  size_t sVar6;
  longlong *S;
  ulong uVar7;
  size_t sVar8;
  ulong nitems;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  longlong *local_68;
  longlong *local_60;
  double local_48;
  
  if (Info != (c_float *)0x0) {
    lVar3 = 0;
    do {
      Info[lVar3] = -1.0;
      (Info + lVar3)[1] = -1.0;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 0x14);
    Info[1] = (double)n;
    *Info = 0.0;
  }
  if ((((-1 < n) && (Ap != (longlong *)0x0)) && (Ai != (longlong *)0x0)) && (P != (longlong *)0x0))
  {
    if (n == 0) {
      return 0;
    }
    sVar6 = Ap[n];
    if (Info != (c_float *)0x0) {
      Info[2] = (double)(long)sVar6;
    }
    if (-1 < (long)sVar6) {
      if (sVar6 < 0x1fffffffffffffff && (ulong)n < 0x1fffffffffffffff) {
        lVar4 = amd_l_valid(n,n,Ap,Ai);
        if (lVar4 == -2) goto LAB_0010be64;
        W = (longlong *)SuiteSparse_malloc(n,8);
        Flag = (longlong *)SuiteSparse_malloc(n,8);
        if (W == (longlong *)0x0 || Flag == (longlong *)0x0) {
          SuiteSparse_free(W);
        }
        else {
          local_48 = (double)n + (double)n;
          if (lVar4 == 1) {
            local_60 = (longlong *)SuiteSparse_malloc(n + 1U,8);
            local_68 = (longlong *)SuiteSparse_malloc(sVar6,8);
            if (local_60 != (longlong *)0x0 && local_68 != (longlong *)0x0) {
              sVar8 = 1;
              if (1 < (long)sVar6) {
                sVar8 = sVar6;
              }
              local_48 = local_48 + (double)(long)(n + 1U) + (double)(long)sVar8;
              amd_l_preprocess(n,Ap,Ai,local_60,local_68,W,Flag);
              Ai = local_68;
              Ap = local_60;
              goto LAB_0010bfb6;
            }
            SuiteSparse_free(local_60);
          }
          else {
            local_60 = (longlong *)0x0;
            local_68 = (longlong *)0x0;
LAB_0010bfb6:
            sVar6 = amd_l_aat(n,Ap,Ai,W,P,Info);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = sVar6;
            auVar2._8_8_ = 4;
            auVar2._0_8_ = 0xcccccccccccccccd;
            nitems = SUB168(auVar1 * auVar2,8) >> 2;
            bVar10 = sVar6 <= nitems;
            if (bVar10) {
              uVar7 = 0;
              uVar9 = nitems;
              do {
                nitems = uVar9 + n;
                bVar10 = uVar9 < nitems;
                if (nitems <= uVar9) break;
                bVar11 = uVar7 < 6;
                uVar7 = uVar7 + 1;
                uVar9 = nitems;
              } while (bVar11);
            }
            if ((bool)(bVar10 ^ 1U | 0x1ffffffffffffffe < nitems)) {
              S = (longlong *)0x0;
            }
            else {
              S = (longlong *)SuiteSparse_malloc(nitems,8);
            }
            if (S != (longlong *)0x0) {
              if (Info != (c_float *)0x0) {
                auVar12._8_4_ = (int)(nitems >> 0x20);
                auVar12._0_8_ = nitems;
                auVar12._12_4_ = 0x45300000;
                Info[7] = (local_48 +
                          (auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)nitems) - 4503599627370496.0)) * 8.0;
                amd_l1(n,Ap,Ai,P,Flag,W,nitems,S,Control,Info);
                SuiteSparse_free(local_60);
                SuiteSparse_free(local_68);
                SuiteSparse_free(W);
                SuiteSparse_free(Flag);
                SuiteSparse_free(S);
                *Info = (double)lVar4;
                return lVar4;
              }
              amd_l1(n,Ap,Ai,P,Flag,W,nitems,S,Control,(c_float *)0x0);
              SuiteSparse_free(local_60);
              SuiteSparse_free(local_68);
              SuiteSparse_free(W);
              SuiteSparse_free(Flag);
              SuiteSparse_free(S);
              return lVar4;
            }
            SuiteSparse_free(local_60);
          }
          SuiteSparse_free(local_68);
          SuiteSparse_free(W);
        }
        SuiteSparse_free(Flag);
      }
      lVar4 = -1;
      if (Info == (c_float *)0x0) {
        return -1;
      }
      cVar5 = -1.0;
      goto LAB_0010be7e;
    }
  }
LAB_0010be64:
  lVar4 = -2;
  if (Info == (c_float *)0x0) {
    return -2;
  }
  cVar5 = -2.0;
LAB_0010be7e:
  *Info = cVar5;
  return lVar4;
}

Assistant:

GLOBAL Int AMD_order
(
    Int n,
    const Int Ap [ ],
    const Int Ai [ ],
    Int P [ ],
    c_float Control [ ],
    c_float Info [ ]
)
{
    Int *Len, *S, nz, i, *Pinv, info, status, *Rp, *Ri, *Cp, *Ci, ok ;
    size_t nzaat, slen ;
    c_float mem = 0 ;

#ifndef NDEBUG
    AMD_debug_init ("amd") ;
#endif

    /* clear the Info array, if it exists */
    info = Info != (c_float *) NULL ;
    if (info)
    {
	for (i = 0 ; i < AMD_INFO ; i++)
	{
	    Info [i] = EMPTY ;
	}
	Info [AMD_N] = n ;
	Info [AMD_STATUS] = AMD_OK ;
    }

    /* make sure inputs exist and n is >= 0 */
    if (Ai == (Int *) NULL || Ap == (Int *) NULL || P == (Int *) NULL || n < 0)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;	    /* arguments are invalid */
    }

    if (n == 0)
    {
	return (AMD_OK) ;	    /* n is 0 so there's nothing to do */
    }

    nz = Ap [n] ;
    if (info)
    {
	Info [AMD_NZ] = nz ;
    }
    if (nz < 0)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;
    }

    /* check if n or nz will cause size_t overflow */
    if (((size_t) n) >= SIZE_T_MAX / sizeof (Int)
     || ((size_t) nz) >= SIZE_T_MAX / sizeof (Int))
    {
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;	    /* problem too large */
    }

    /* check the input matrix:	AMD_OK, AMD_INVALID, or AMD_OK_BUT_JUMBLED */
    status = AMD_valid (n, n, Ap, Ai) ;

    if (status == AMD_INVALID)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;	    /* matrix is invalid */
    }

    /* allocate two size-n integer workspaces */
    Len  = SuiteSparse_malloc (n, sizeof (Int)) ;
    Pinv = SuiteSparse_malloc (n, sizeof (Int)) ;
    mem += n ;
    mem += n ;
    if (!Len || !Pinv)
    {
	/* :: out of memory :: */
	SuiteSparse_free (Len) ;
	SuiteSparse_free (Pinv) ;
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;
    }

    if (status == AMD_OK_BUT_JUMBLED)
    {
	/* sort the input matrix and remove duplicate entries */
	AMD_DEBUG1 (("Matrix is jumbled\n")) ;
	Rp = SuiteSparse_malloc (n+1, sizeof (Int)) ;
	Ri = SuiteSparse_malloc (nz,  sizeof (Int)) ;
	mem += (n+1) ;
	mem += MAX (nz,1) ;
	if (!Rp || !Ri)
	{
	    /* :: out of memory :: */
	    SuiteSparse_free (Rp) ;
	    SuiteSparse_free (Ri) ;
	    SuiteSparse_free (Len) ;
	    SuiteSparse_free (Pinv) ;
	    if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	    return (AMD_OUT_OF_MEMORY) ;
	}
	/* use Len and Pinv as workspace to create R = A' */
	AMD_preprocess (n, Ap, Ai, Rp, Ri, Len, Pinv) ;
	Cp = Rp ;
	Ci = Ri ;
    }
    else
    {
	/* order the input matrix as-is.  No need to compute R = A' first */
	Rp = NULL ;
	Ri = NULL ;
	Cp = (Int *) Ap ;
	Ci = (Int *) Ai ;
    }

    /* --------------------------------------------------------------------- */
    /* determine the symmetry and count off-diagonal nonzeros in A+A' */
    /* --------------------------------------------------------------------- */

    nzaat = AMD_aat (n, Cp, Ci, Len, P, Info) ;
    AMD_DEBUG1 (("nzaat: %g\n", (c_float) nzaat)) ;
    ASSERT ((MAX (nz-n, 0) <= nzaat) && (nzaat <= 2 * (size_t) nz)) ;

    /* --------------------------------------------------------------------- */
    /* allocate workspace for matrix, elbow room, and 6 size-n vectors */
    /* --------------------------------------------------------------------- */

    S = NULL ;
    slen = nzaat ;			/* space for matrix */
    ok = ((slen + nzaat/5) >= slen) ;	/* check for size_t overflow */
    slen += nzaat/5 ;			/* add elbow room */
    for (i = 0 ; ok && i < 7 ; i++)
    {
	ok = ((slen + n) > slen) ;	/* check for size_t overflow */
	slen += n ;			/* size-n elbow room, 6 size-n work */
    }
    mem += slen ;
    ok = ok && (slen < SIZE_T_MAX / sizeof (Int)) ; /* check for overflow */
    ok = ok && (slen < Int_MAX) ;	/* S[i] for Int i must be OK */
    if (ok)
    {
	S = SuiteSparse_malloc (slen, sizeof (Int)) ;
    }
    AMD_DEBUG1 (("slen %g\n", (c_float) slen)) ;
    if (!S)
    {
	/* :: out of memory :: (or problem too large) */
	SuiteSparse_free (Rp) ;
	SuiteSparse_free (Ri) ;
	SuiteSparse_free (Len) ;
	SuiteSparse_free (Pinv) ;
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;
    }
    if (info)
    {
	/* memory usage, in bytes. */
	Info [AMD_MEMORY] = mem * sizeof (Int) ;
    }

    /* --------------------------------------------------------------------- */
    /* order the matrix */
    /* --------------------------------------------------------------------- */

    AMD_1 (n, Cp, Ci, P, Pinv, Len, slen, S, Control, Info) ;

    /* --------------------------------------------------------------------- */
    /* free the workspace */
    /* --------------------------------------------------------------------- */

    SuiteSparse_free (Rp) ;
    SuiteSparse_free (Ri) ;
    SuiteSparse_free (Len) ;
    SuiteSparse_free (Pinv) ;
    SuiteSparse_free (S) ;
    if (info) Info [AMD_STATUS] = status ;
    return (status) ;	    /* successful ordering */
}